

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStreamWithGuards *node;
  undefined4 in_register_00000034;
  PromiseArena *pPVar1;
  AsyncIoStreamWithGuards *local_48;
  PromiseArena *local_40;
  _func_int **local_38;
  EventLoop *local_30;
  
  pPVar1 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  if (pPVar1->bytes[0x49] == '\x01') {
    (*(code *)**(undefined8 **)(*(long *)(pPVar1->bytes + 0x20) + 8))
              (this,*(long *)(pPVar1->bytes + 0x20) + 8,__buf,__n);
  }
  else {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
    local_40 = pPVar1;
    local_38 = (_func_int **)__buf;
    local_30 = (EventLoop *)__n;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_1_>
              ((Promise<void> *)this,(anon_class_24_2_36b6643b_for_func *)&stack0xffffffffffffffb8);
    node = local_48;
    if (local_48 != (AsyncIoStreamWithGuards *)0x0) {
      local_48 = (AsyncIoStreamWithGuards *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (writeGuardReleased) {
      return inner->write(buffer);
    } else {
      return writeGuard.addBranch().then([this,buffer]() {
        return inner->write(buffer);
      });
    }
  }